

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O3

void __thiscall Init::RenameOptions::reflect(RenameOptions *this,StringWriter *writer)

{
  string local_40;
  
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(writer);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"prepareProvider","");
  reflectBool(writer,&local_40,this->prepareProvider,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(writer,0);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "prepareProvider", prepareProvider);
            writer.EndObject();
        }